

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<6UL> * __thiscall GF2::WW<6ul>::SetHi<3ul>(WW<6UL> *this,WW<3UL> *w)

{
  long *in_RSI;
  WW<6UL> *in_RDI;
  size_t pos_1;
  size_t pos;
  size_t offset;
  size_t start;
  
  in_RDI->_words[0] = in_RDI->_words[0] << 0x3d;
  in_RDI->_words[0] = in_RDI->_words[0] >> 0x3d;
  in_RDI->_words[0] = *in_RSI << 3 | in_RDI->_words[0];
  WW<6UL>::Trim(in_RDI);
  return in_RDI;
}

Assistant:

WW& SetHi(const WW<_m>& w)
	{
		static_assert(_m <= _n);
		// первое слово, в котором начинается правая часть
		size_t start = (_n - _m) / B_PER_W;
		// правая часть начинается посередине слова (со смещением offset)?
		if (size_t offset = (_n - _m) % B_PER_W)
		{
			// очистить старшие B_PER_W - offset битов _words[start]
			(_words[start] <<= B_PER_W - offset) >>= B_PER_W - offset;
			// и записать в них младшие биты первого слова w
			_words[start] |= w._words[0] << offset;
			// далее объединять биты двух последовательных слов w
			size_t pos;
			for (pos = 1; pos < w._wcount; ++pos)
				_words[pos + start] = (w._words[pos] << offset) |
					(w._words[pos - 1] >> (B_PER_W - offset));
			// обработать остатки
			if (pos + start < _wcount)
				_words[pos + start] = w._words[pos - 1] >> (B_PER_W - offset);
		}
		else 
			for (size_t pos = 0; pos < w._wcount; ++pos)
				_words[pos + start] = w._words[pos];
		Trim();
		return *this;
	}